

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.cpp
# Opt level: O3

bool SanityTest(pfHash hash,int hashbits)

{
  byte bVar1;
  int iVar2;
  void *blob;
  void *blob_00;
  void *__s;
  void *__s_00;
  long lVar3;
  bool bVar4;
  char *__format;
  uint uVar5;
  ulong uVar7;
  char *__s_01;
  void *__dest;
  uint32_t bit;
  int local_9c;
  uint32_t local_94;
  size_t local_90;
  Rand local_48;
  int iVar6;
  
  local_9c = 0;
  printf("Running sanity check 1     ");
  iVar6 = hashbits + 7;
  if (-1 < hashbits) {
    iVar6 = hashbits;
  }
  uVar5 = iVar6 >> 3;
  local_48.x = 0x19e37934;
  local_48.y = 0x7bc33027;
  local_48.z = 0xa48a5061;
  local_48.w = 0x1bcbea7b;
  blob = operator_new__(0x130);
  blob_00 = operator_new__(0x130);
  uVar7 = (ulong)(int)uVar5;
  __s = operator_new__(uVar7);
  __s_00 = operator_new__(uVar7);
  memset(__s,1,uVar7);
  memset(__s_00,2,uVar7);
  do {
    putchar(0x2e);
    local_94 = 0x20;
    local_90 = 4;
    do {
      lVar3 = 0x10;
      do {
        __dest = (void *)((long)blob_00 + lVar3 + 0x10);
        Rand::rand_p(&local_48,blob,0x130);
        Rand::rand_p(&local_48,blob_00,0x130);
        memcpy(__dest,(void *)((long)blob + 0x10),local_90);
        bit = 0;
        iVar6 = (int)local_90;
        (*hash)((void *)((long)blob + 0x10),iVar6,0,__s);
        do {
          flipbit(__dest,iVar6,bit);
          (*hash)(__dest,iVar6,0,__s_00);
          iVar2 = bcmp(__s,__s_00,uVar7);
          if (iVar2 == 0) {
            if (hashbits < 8) goto LAB_001625d8;
            uVar7 = 0;
            goto LAB_00162585;
          }
          flipbit(__dest,iVar6,bit);
          (*hash)(__dest,iVar6,0,__s_00);
          iVar2 = bcmp(__s,__s_00,uVar7);
          if (iVar2 != 0) {
            if (hashbits < 8) goto LAB_001625d8;
            uVar7 = 0;
            goto LAB_001625b7;
          }
          bit = bit + 1;
        } while (local_94 != bit);
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x20);
      local_94 = local_94 + 8;
      local_90 = local_90 + 1;
    } while (local_90 != 0x101);
    local_9c = local_9c + 1;
  } while (local_9c != 10);
  bVar4 = true;
  __s_01 = " PASS";
  goto LAB_001625f9;
  while (uVar7 = uVar7 + 1, uVar5 != uVar7) {
LAB_00162585:
    bVar1 = *(byte *)((long)__s + uVar7);
    if (bVar1 == *(byte *)((long)__s_00 + uVar7)) {
      __format = " %d: 0x%02X == 0x%02X ";
      goto LAB_001625f2;
    }
  }
  goto LAB_001625d8;
  while (uVar7 = uVar7 + 1, uVar5 != uVar7) {
LAB_001625b7:
    bVar1 = *(byte *)((long)__s + uVar7);
    if (bVar1 != *(byte *)((long)__s_00 + uVar7)) {
      __format = " %d: 0x%02X != 0x%02X ";
LAB_001625f2:
      bVar4 = false;
      __s_01 = " FAIL  !!!!!";
      printf(__format,uVar7,(ulong)bVar1);
      goto LAB_001625f9;
    }
  }
LAB_001625d8:
  __s_01 = " FAIL  !!!!!";
  bVar4 = false;
LAB_001625f9:
  puts(__s_01);
  operator_delete__(blob);
  operator_delete__(blob_00);
  operator_delete__(__s);
  operator_delete__(__s_00);
  return bVar4;
}

Assistant:

bool SanityTest ( pfHash hash, const int hashbits )
{
  printf("Running sanity check 1     ");

  Rand r(883741);

  bool result = true;

  const int hashbytes = hashbits/8;
  const int reps = 10;
  const int keymax = 256;
  const int pad = 16;
  const int buflen = keymax + pad*3;

  uint8_t * buffer1 = new uint8_t[buflen];
  uint8_t * buffer2 = new uint8_t[buflen];

  uint8_t * hash1 = new uint8_t[hashbytes];
  uint8_t * hash2 = new uint8_t[hashbytes];

  //----------
  memset(hash1, 1, hashbytes);
  memset(hash2, 2, hashbytes);
  
  for(int irep = 0; irep < reps; irep++)
  {
    if(irep % (reps/10) == 0) printf(".");

    for(int len = 4; len <= keymax; len++)
    {
      for(int offset = pad; offset < pad*2; offset++)
      {
        uint8_t * key1 = &buffer1[pad];
        uint8_t * key2 = &buffer2[pad+offset];

        r.rand_p(buffer1,buflen);
        r.rand_p(buffer2,buflen);

        memcpy(key2,key1,len);

        hash(key1,len,0,hash1);

        for(int bit = 0; bit < (len * 8); bit++)
        {
          // Flip a bit, hash the key -> we should get a different result.

          flipbit(key2,len,bit);
          hash(key2,len,0,hash2);

          if(memcmp(hash1,hash2,hashbytes) == 0)
            {
              for(int i=0; i < hashbytes; i++){
                if (hash1[i] == hash2[i]) {
                  printf(" %d: 0x%02X == 0x%02X ", i, hash1[i], hash2[i]);
                  break;
                }
              }
              result = false;
              goto end_sanity;
            }

          // Flip it back, hash again -> we should get the original result.

          flipbit(key2,len,bit);
          hash(key2,len,0,hash2);

          if(memcmp(hash1,hash2,hashbytes) != 0)
            {
              for(int i=0; i < hashbytes; i++){
                if (hash1[i] != hash2[i]) {
                  printf(" %d: 0x%02X != 0x%02X ", i, hash1[i], hash2[i]);
                  break;
                }
              }
              result = false;
              goto end_sanity;
            }
        }
      }
    }
  }

 end_sanity:
  if(result == false)
  {
    printf(" FAIL  !!!!!\n");
  }
  else
  {
    printf(" PASS\n");
  }

  delete [] buffer1;
  delete [] buffer2;

  delete [] hash1;
  delete [] hash2;

  return result;
}